

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# die.h
# Opt level: O3

int __thiscall ORPG::Die::roll(Die *this)

{
  uint uVar1;
  ulong uVar2;
  size_t __i;
  long lVar3;
  uniform_int_distribution<int> dist;
  mt19937 mt;
  random_device rd;
  uniform_int_distribution<int> local_2730;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2728;
  random_device local_13a0;
  
  std::random_device::random_device(&local_13a0);
  uVar1 = std::random_device::_M_getval();
  local_2728._M_x[0] = (unsigned_long)uVar1;
  lVar3 = 1;
  uVar2 = local_2728._M_x[0];
  do {
    uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar3);
    local_2728._M_x[lVar3] = uVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  local_2728._M_p = 0x270;
  local_2730._M_param._M_b = this->_MAX;
  local_2730._M_param._M_a = 1;
  uVar1 = std::uniform_int_distribution<int>::operator()
                    (&local_2730,&local_2728,&local_2730._M_param);
  if ((char)Core::VB_FLAG == '\x01') {
    printf("d%i -> %i\n",(ulong)(uint)this->_MAX,(ulong)uVar1);
  }
  std::random_device::_M_fini();
  return uVar1;
}

Assistant:

int roll() {
                std::random_device rd;
                std::mt19937 mt(rd());
                std::uniform_int_distribution<int> dist(1, _MAX);

                auto ret = dist(mt);

                /* verbosely prints die rolls in the form "dX -> N" */
                if(Core::VB_FLAG) printf("d%i -> %i\n", _MAX, ret);

                return ret;
            }